

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::TiledOutputFile::initialize(TiledOutputFile *this,Header *header)

{
  int maxX;
  int minY;
  int maxY;
  uint uVar1;
  char *pcVar2;
  LevelMode LVar3;
  LevelRoundingMode LVar4;
  bool bVar5;
  int iVar6;
  Format FVar7;
  LineOrder *pLVar8;
  TileDescription *pTVar9;
  Box2i *pBVar10;
  size_t sVar11;
  TileBuffer *pTVar12;
  Compression *pCVar13;
  Compressor *pCVar14;
  char *pcVar15;
  pointer ppTVar16;
  ulong uVar17;
  Data *pDVar18;
  TileOffsets local_70;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_48;
  
  Header::operator=(&this->_data->header,header);
  pLVar8 = Header::lineOrder(&this->_data->header);
  pDVar18 = this->_data;
  pDVar18->lineOrder = *pLVar8;
  pTVar9 = Header::tileDescription(&pDVar18->header);
  pDVar18 = this->_data;
  uVar1 = pTVar9->ySize;
  LVar3 = pTVar9->mode;
  LVar4 = pTVar9->roundingMode;
  (pDVar18->tileDesc).xSize = pTVar9->xSize;
  (pDVar18->tileDesc).ySize = uVar1;
  (pDVar18->tileDesc).mode = LVar3;
  (pDVar18->tileDesc).roundingMode = LVar4;
  bVar5 = Header::hasType(&this->_data->header);
  if (bVar5) {
    Header::setType(&this->_data->header,(string *)&Imf_2_5::TILEDIMAGE_abi_cxx11_);
  }
  pBVar10 = Header::dataWindow(&this->_data->header);
  iVar6 = (pBVar10->min).x;
  pDVar18 = this->_data;
  pDVar18->minX = iVar6;
  maxX = (pBVar10->max).x;
  pDVar18->maxX = maxX;
  minY = (pBVar10->min).y;
  pDVar18->minY = minY;
  maxY = (pBVar10->max).y;
  pDVar18->maxY = maxY;
  precalculateTileInfo
            (&pDVar18->tileDesc,iVar6,maxX,minY,maxY,&pDVar18->numXTiles,&pDVar18->numYTiles,
             &pDVar18->numXLevels,&pDVar18->numYLevels);
  pDVar18 = this->_data;
  if (pDVar18->lineOrder == INCREASING_Y) {
    iVar6 = 0;
  }
  else {
    iVar6 = *pDVar18->numYTiles + -1;
  }
  (pDVar18->nextTileToWrite).dx = 0;
  (pDVar18->nextTileToWrite).dy = iVar6;
  (pDVar18->nextTileToWrite).lx = 0;
  (pDVar18->nextTileToWrite).ly = 0;
  sVar11 = calculateBytesPerPixel(&pDVar18->header);
  pDVar18 = this->_data;
  uVar1 = (pDVar18->tileDesc).ySize;
  sVar11 = (pDVar18->tileDesc).xSize * sVar11;
  pDVar18->maxBytesPerTileLine = sVar11;
  pDVar18->tileBufferSize = uVar1 * sVar11;
  pDVar18 = this->_data;
  ppTVar16 = (pDVar18->tileBuffers).
             super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((pDVar18->tileBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar16) {
    uVar17 = 0;
    do {
      pTVar12 = (TileBuffer *)operator_new(0x88);
      pCVar13 = Header::compression(&pDVar18->header);
      pDVar18 = this->_data;
      pCVar14 = newTileCompressor(*pCVar13,pDVar18->maxBytesPerTileLine,
                                  (ulong)(pDVar18->tileDesc).ySize,&pDVar18->header);
      *(undefined8 *)((long)&pTVar12->buffer + 4) = 0;
      *(undefined8 *)&pTVar12->field_0x14 = 0;
      pTVar12->uncompressedData = (char *)0x0;
      pTVar12->buffer = (char *)0x0;
      *(Compressor **)&pTVar12->format = pCVar14;
      pTVar12->dy = 0;
      pTVar12->lx = 0;
      pTVar12->ly = 0;
      pTVar12->hasException = false;
      *(undefined3 *)&pTVar12->field_0x35 = 0;
      *(undefined1 *)&(pTVar12->exception)._M_dataplus._M_p = 0;
      (pTVar12->exception)._M_string_length = (size_type)((long)&(pTVar12->exception).field_2 + 8);
      (pTVar12->exception).field_2._M_allocated_capacity = 0;
      (pTVar12->exception).field_2._M_local_buf[8] = '\0';
      IlmThread_2_5::Semaphore::Semaphore((Semaphore *)&pTVar12->field_0x60,1);
      (this->_data->tileBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar17] = pTVar12;
      pcVar2 = (char *)this->_data->tileBufferSize;
      pTVar12 = (this->_data->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar17];
      pcVar15 = (char *)operator_new__((ulong)pcVar2);
      if (pTVar12->buffer != (char *)0x0) {
        operator_delete__(pTVar12->buffer);
      }
      pTVar12->uncompressedData = pcVar2;
      pTVar12->buffer = pcVar15;
      uVar17 = uVar17 + 1;
      pDVar18 = this->_data;
      ppTVar16 = (pDVar18->tileBuffers).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar17 < (ulong)((long)(pDVar18->tileBuffers).
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar16 >> 3
                             ));
  }
  FVar7 = defaultFormat(*(Compressor **)&(*ppTVar16)->format);
  pDVar18 = this->_data;
  pDVar18->format = FVar7;
  TileOffsets::TileOffsets
            (&local_70,(pDVar18->tileDesc).mode,pDVar18->numXLevels,pDVar18->numYLevels,
             pDVar18->numXTiles,pDVar18->numYTiles);
  pDVar18 = this->_data;
  (pDVar18->tileOffsets)._numYLevels = local_70._numYLevels;
  (pDVar18->tileOffsets)._mode = local_70._mode;
  (pDVar18->tileOffsets)._numXLevels = local_70._numXLevels;
  local_48.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pDVar18->tileOffsets)._offsets.
       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pDVar18->tileOffsets)._offsets.
       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pDVar18->tileOffsets)._offsets.
       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pDVar18->tileOffsets)._offsets.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_70._offsets.
       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pDVar18->tileOffsets)._offsets.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_70._offsets.
       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pDVar18->tileOffsets)._offsets.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_70._offsets.
       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70._offsets.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70._offsets.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70._offsets.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector(&local_70._offsets);
  return;
}

Assistant:

void
TiledOutputFile::initialize (const Header &header)
{
    _data->header = header;
    _data->lineOrder = _data->header.lineOrder();

    
    
    //
    // Check that the file is indeed tiled
    //

    _data->tileDesc = _data->header.tileDescription();

    
    //
    // 'Fix' the type attribute if it exists but is incorrectly set
    // (attribute is optional, but ensure it is correct if it exists)
    //
    if(_data->header.hasType())
    {
        _data->header.setType(TILEDIMAGE);
    }

    
    //
    // Save the dataWindow information
    //

    const Box2i &dataWindow = _data->header.dataWindow();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (_data->tileDesc,
			  _data->minX, _data->maxX,
			  _data->minY, _data->maxY,
			  _data->numXTiles, _data->numYTiles,
			  _data->numXLevels, _data->numYLevels);       
    
    //
    // Determine the first tile coordinate that we will be writing
    // if the file is not RANDOM_Y.
    //
    
    _data->nextTileToWrite = (_data->lineOrder == INCREASING_Y)?
			       TileCoord (0, 0, 0, 0):
			       TileCoord (0, _data->numYTiles[0] - 1, 0, 0);

    _data->maxBytesPerTileLine =
	    calculateBytesPerPixel (_data->header) * _data->tileDesc.xSize;

    _data->tileBufferSize = _data->maxBytesPerTileLine * _data->tileDesc.ySize;
     
    //
    // Create all the TileBuffers and allocate their internal buffers
    //

    for (size_t i = 0; i < _data->tileBuffers.size(); i++)
    {
        _data->tileBuffers[i] = new TileBuffer (newTileCompressor
						  (_data->header.compression(),
						   _data->maxBytesPerTileLine,
						   _data->tileDesc.ySize,
						   _data->header));

        _data->tileBuffers[i]->buffer.resizeErase(_data->tileBufferSize);
    }

    _data->format = defaultFormat (_data->tileBuffers[0]->compressor);

    _data->tileOffsets = TileOffsets (_data->tileDesc.mode,
				      _data->numXLevels,
				      _data->numYLevels,
				      _data->numXTiles,
				      _data->numYTiles);
}